

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_memory_storage.cpp
# Opt level: O2

void __thiscall
cppcms::sessions::session_memory_storage::save
          (session_memory_storage *this,string *key,time_t to,string *value)

{
  iterator pcVar1;
  iterator iVar2;
  pair<cppcms::impl::details::basic_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::sessions::session_memory_storage::_data,_cppcms::impl::string_hash,_cppcms::impl::details::are_equal,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::sessions::session_memory_storage::_data>_>_>::container_*,_bool>
  pVar3;
  unique_lock<booster::shared_mutex> lock;
  unique_lock<booster::shared_mutex> uStack_118;
  undefined1 local_108 [8];
  _Alloc_hider _Stack_100;
  size_type local_f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_f0;
  iterator iStack_e0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::sessions::session_memory_storage::_data>
  local_d0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::sessions::session_memory_storage::_data>
  local_80;
  
  std::unique_lock<booster::shared_mutex>::unique_lock(&uStack_118,&this->mutex_);
  pcVar1 = cppcms::impl::details::
           basic_map<std::__cxx11::string,cppcms::sessions::session_memory_storage::_data,cppcms::impl::string_hash,cppcms::impl::details::are_equal,std::allocator<std::pair<std::__cxx11::string,cppcms::sessions::session_memory_storage::_data>>>
           ::find<std::__cxx11::string>
                     ((basic_map<std::__cxx11::string,cppcms::sessions::session_memory_storage::_data,cppcms::impl::string_hash,cppcms::impl::details::are_equal,std::allocator<std::pair<std::__cxx11::string,cppcms::sessions::session_memory_storage::_data>>>
                       *)&this->map_,key);
  local_d0.first._M_dataplus._M_p = (pointer)to;
  if (pcVar1 == (iterator)0x0) {
    local_108 = (undefined1  [8])0x0;
    local_f8 = 0;
    aStack_f0._8_8_ = 0;
    iStack_e0._M_node = (_Base_ptr)0x0;
    _Stack_100._M_p = (pointer)&aStack_f0;
    aStack_f0._M_allocated_capacity = 0;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::sessions::session_memory_storage::_data>
    ::pair<cppcms::sessions::session_memory_storage::_data,_true>(&local_80,key,(_data *)local_108);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::sessions::session_memory_storage::_data>
    ::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::sessions::session_memory_storage::_data,_true>
              (&local_d0,&local_80);
    pVar3 = cppcms::impl::details::
            basic_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::sessions::session_memory_storage::_data,_cppcms::impl::string_hash,_cppcms::impl::details::are_equal,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::sessions::session_memory_storage::_data>_>_>
            ::insert(&(this->map_).impl_,&local_d0);
    pcVar1 = pVar3.first;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::sessions::session_memory_storage::_data>
    ::~pair(&local_d0);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::sessions::session_memory_storage::_data>
    ::~pair(&local_80);
    std::__cxx11::string::~string((string *)&_Stack_100);
    (pcVar1->val).second.timeout = to;
    std::__cxx11::string::_M_assign((string *)&(pcVar1->val).second.info);
    local_d0.first._M_string_length = (size_type)pcVar1;
    iVar2 = std::
            _Rb_tree<long,std::pair<long_const,cppcms::impl::hash_map<std::__cxx11::string,cppcms::sessions::session_memory_storage::_data,cppcms::impl::string_hash,cppcms::impl::details::are_equal,std::allocator<std::pair<std::__cxx11::string,cppcms::sessions::session_memory_storage::_data>>>::iterator>,std::_Select1st<std::pair<long_const,cppcms::impl::hash_map<std::__cxx11::string,cppcms::sessions::session_memory_storage::_data,cppcms::impl::string_hash,cppcms::impl::details::are_equal,std::allocator<std::pair<std::__cxx11::string,cppcms::sessions::session_memory_storage::_data>>>::iterator>>,std::less<long>,std::allocator<std::pair<long_const,cppcms::impl::hash_map<std::__cxx11::string,cppcms::sessions::session_memory_storage::_data,cppcms::impl::string_hash,cppcms::impl::details::are_equal,std::allocator<std::pair<std::__cxx11::string,cppcms::sessions::session_memory_storage::_data>>>::iterator>>>
            ::
            _M_emplace_equal<std::pair<long,cppcms::impl::hash_map<std::__cxx11::string,cppcms::sessions::session_memory_storage::_data,cppcms::impl::string_hash,cppcms::impl::details::are_equal,std::allocator<std::pair<std::__cxx11::string,cppcms::sessions::session_memory_storage::_data>>>::iterator>>
                      ((_Rb_tree<long,std::pair<long_const,cppcms::impl::hash_map<std::__cxx11::string,cppcms::sessions::session_memory_storage::_data,cppcms::impl::string_hash,cppcms::impl::details::are_equal,std::allocator<std::pair<std::__cxx11::string,cppcms::sessions::session_memory_storage::_data>>>::iterator>,std::_Select1st<std::pair<long_const,cppcms::impl::hash_map<std::__cxx11::string,cppcms::sessions::session_memory_storage::_data,cppcms::impl::string_hash,cppcms::impl::details::are_equal,std::allocator<std::pair<std::__cxx11::string,cppcms::sessions::session_memory_storage::_data>>>::iterator>>,std::less<long>,std::allocator<std::pair<long_const,cppcms::impl::hash_map<std::__cxx11::string,cppcms::sessions::session_memory_storage::_data,cppcms::impl::string_hash,cppcms::impl::details::are_equal,std::allocator<std::pair<std::__cxx11::string,cppcms::sessions::session_memory_storage::_data>>>::iterator>>>
                        *)&this->timeout_,
                       (pair<long,_cppcms::impl::hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::sessions::session_memory_storage::_data,_cppcms::impl::string_hash,_cppcms::impl::details::are_equal,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::sessions::session_memory_storage::_data>_>_>::iterator>
                        *)&local_d0);
    (pcVar1->val).second.timeout_ptr._M_node = iVar2._M_node;
  }
  else {
    std::
    _Rb_tree<long,std::pair<long_const,cppcms::impl::hash_map<std::__cxx11::string,cppcms::sessions::session_memory_storage::_data,cppcms::impl::string_hash,cppcms::impl::details::are_equal,std::allocator<std::pair<std::__cxx11::string,cppcms::sessions::session_memory_storage::_data>>>::iterator>,std::_Select1st<std::pair<long_const,cppcms::impl::hash_map<std::__cxx11::string,cppcms::sessions::session_memory_storage::_data,cppcms::impl::string_hash,cppcms::impl::details::are_equal,std::allocator<std::pair<std::__cxx11::string,cppcms::sessions::session_memory_storage::_data>>>::iterator>>,std::less<long>,std::allocator<std::pair<long_const,cppcms::impl::hash_map<std::__cxx11::string,cppcms::sessions::session_memory_storage::_data,cppcms::impl::string_hash,cppcms::impl::details::are_equal,std::allocator<std::pair<std::__cxx11::string,cppcms::sessions::session_memory_storage::_data>>>::iterator>>>
    ::erase_abi_cxx11_((_Rb_tree<long,std::pair<long_const,cppcms::impl::hash_map<std::__cxx11::string,cppcms::sessions::session_memory_storage::_data,cppcms::impl::string_hash,cppcms::impl::details::are_equal,std::allocator<std::pair<std::__cxx11::string,cppcms::sessions::session_memory_storage::_data>>>::iterator>,std::_Select1st<std::pair<long_const,cppcms::impl::hash_map<std::__cxx11::string,cppcms::sessions::session_memory_storage::_data,cppcms::impl::string_hash,cppcms::impl::details::are_equal,std::allocator<std::pair<std::__cxx11::string,cppcms::sessions::session_memory_storage::_data>>>::iterator>>,std::less<long>,std::allocator<std::pair<long_const,cppcms::impl::hash_map<std::__cxx11::string,cppcms::sessions::session_memory_storage::_data,cppcms::impl::string_hash,cppcms::impl::details::are_equal,std::allocator<std::pair<std::__cxx11::string,cppcms::sessions::session_memory_storage::_data>>>::iterator>>>
                        *)&this->timeout_,(pcVar1->val).second.timeout_ptr._M_node);
    (pcVar1->val).second.timeout = to;
    std::__cxx11::string::_M_assign((string *)&(pcVar1->val).second.info);
    local_d0.first._M_string_length = (size_type)pcVar1;
    iVar2 = std::
            _Rb_tree<long,std::pair<long_const,cppcms::impl::hash_map<std::__cxx11::string,cppcms::sessions::session_memory_storage::_data,cppcms::impl::string_hash,cppcms::impl::details::are_equal,std::allocator<std::pair<std::__cxx11::string,cppcms::sessions::session_memory_storage::_data>>>::iterator>,std::_Select1st<std::pair<long_const,cppcms::impl::hash_map<std::__cxx11::string,cppcms::sessions::session_memory_storage::_data,cppcms::impl::string_hash,cppcms::impl::details::are_equal,std::allocator<std::pair<std::__cxx11::string,cppcms::sessions::session_memory_storage::_data>>>::iterator>>,std::less<long>,std::allocator<std::pair<long_const,cppcms::impl::hash_map<std::__cxx11::string,cppcms::sessions::session_memory_storage::_data,cppcms::impl::string_hash,cppcms::impl::details::are_equal,std::allocator<std::pair<std::__cxx11::string,cppcms::sessions::session_memory_storage::_data>>>::iterator>>>
            ::
            _M_emplace_equal<std::pair<long,cppcms::impl::hash_map<std::__cxx11::string,cppcms::sessions::session_memory_storage::_data,cppcms::impl::string_hash,cppcms::impl::details::are_equal,std::allocator<std::pair<std::__cxx11::string,cppcms::sessions::session_memory_storage::_data>>>::iterator>>
                      ((_Rb_tree<long,std::pair<long_const,cppcms::impl::hash_map<std::__cxx11::string,cppcms::sessions::session_memory_storage::_data,cppcms::impl::string_hash,cppcms::impl::details::are_equal,std::allocator<std::pair<std::__cxx11::string,cppcms::sessions::session_memory_storage::_data>>>::iterator>,std::_Select1st<std::pair<long_const,cppcms::impl::hash_map<std::__cxx11::string,cppcms::sessions::session_memory_storage::_data,cppcms::impl::string_hash,cppcms::impl::details::are_equal,std::allocator<std::pair<std::__cxx11::string,cppcms::sessions::session_memory_storage::_data>>>::iterator>>,std::less<long>,std::allocator<std::pair<long_const,cppcms::impl::hash_map<std::__cxx11::string,cppcms::sessions::session_memory_storage::_data,cppcms::impl::string_hash,cppcms::impl::details::are_equal,std::allocator<std::pair<std::__cxx11::string,cppcms::sessions::session_memory_storage::_data>>>::iterator>>>
                        *)&this->timeout_,
                       (pair<long,_cppcms::impl::hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::sessions::session_memory_storage::_data,_cppcms::impl::string_hash,_cppcms::impl::details::are_equal,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::sessions::session_memory_storage::_data>_>_>::iterator>
                        *)&local_d0);
    (pcVar1->val).second.timeout_ptr._M_node = iVar2._M_node;
  }
  short_gc(this);
  std::unique_lock<booster::shared_mutex>::~unique_lock(&uStack_118);
  return;
}

Assistant:

void save(std::string const &key,time_t to,std::string const &value)
	{
		booster::unique_lock<booster::shared_mutex> lock(mutex_);
		pointer p=map_.find(key);
		if(p==map_.end()) {
			std::pair<pointer,bool> pr = map_.insert(std::pair<std::string,_data>(key,_data()));
			pointer p = pr.first;
			p->second.timeout=to;
			p->second.info=value;
			p->second.timeout_ptr=timeout_.insert(std::pair<time_t,pointer>(to,p));
		}
		else {
			timeout_.erase(p->second.timeout_ptr);
			p->second.timeout=to;
			p->second.info=value;
			p->second.timeout_ptr=timeout_.insert(std::pair<time_t,pointer>(to,p));
		}
		short_gc();
	}